

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  iterator __first;
  iterator __last;
  type *this;
  type *this_00;
  reference pdVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  type *max;
  type *min;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  double *local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  double local_48;
  double sum;
  double distance;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> distances;
  
  distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Enter distances between city A and B separated by \'space\'. ");
  std::operator<<(poVar3,"To terminate input enter \'.\' and press \'enter\':\n");
  sum = 0.0;
  while( true ) {
    plVar4 = (long *)std::istream::operator>>((istream *)&std::cin,&sum);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar2) break;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_28,&sum);
  }
  local_50._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_28);
  local_58 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_28);
  local_48 = std::
             accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                       (local_50,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  )local_58,0.0);
  __first = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_28);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_28);
  local_68 = std::
             minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        __first._M_current,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        __last._M_current);
  this = std::
         get<0ul,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                   (&local_68);
  this_00 = std::
            get<1ul,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (&local_68);
  poVar3 = std::operator<<((ostream *)&std::cout,"Total distance: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48);
  poVar3 = std::operator<<(poVar3,"\nThe smallest distance: ");
  pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
  poVar3 = std::operator<<(poVar3,"\nThe biggest distance: ");
  pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(this_00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
  poVar3 = std::operator<<(poVar3,"\nThe mean distance: ");
  dVar1 = local_48;
  sVar6 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_28);
  auVar7._8_4_ = (int)(sVar6 >> 0x20);
  auVar7._0_8_ = sVar6;
  auVar7._12_4_ = 0x45300000;
  std::ostream::operator<<
            (poVar3,dVar1 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)));
  distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	std::vector<double> distances;
	std::cout << "Enter distances between city A and B separated by 'space'. "
			  << "To terminate input enter '.' and press 'enter':\n";
	for (double distance = 0; std::cin >> distance;)
	{
		distances.push_back(distance);
	}
	auto sum = std::accumulate(distances.begin(), distances.end(), 0.0);
	auto [min, max] = std::minmax_element(distances.begin(), distances.end());
	std::cout << "Total distance: "
			  << sum
			  << "\nThe smallest distance: " << *min
			  << "\nThe biggest distance: " << *max
			  << "\nThe mean distance: " << sum / distances.size();
	return 0;
}